

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats_publisher.cc
# Opt level: O2

void __thiscall StatsPublisher::publish(StatsPublisher *this,string *str)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  runtime_error *this_00;
  int *in_R9;
  char local_3c [4];
  string local_38;
  
  bVar1 = Publisher::hasSubscribers((Publisher *)this);
  if (bVar1) {
    iVar2 = nn_send(*(int *)&(this->bind).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,(str->_M_dataplus)._M_p,
                    str->_M_string_length,0);
    __stream = _stderr;
    if (iVar2 < 0) {
      iVar2 = nn_errno();
      pcVar3 = nn_strerror(iVar2);
      fprintf(__stream,"nn_send: %s\n",pcVar3);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_3c[0] = '\x1d';
      local_3c[1] = '\0';
      local_3c[2] = '\0';
      local_3c[3] = '\0';
      util::str<char[29],char[105],char[2],int>
                (&local_38,(util *)"Assertion `false` failed at ",
                 (char (*) [29])
                 "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/src/goesrecv/stats_publisher.cc"
                 ,(char (*) [105])0x16a222,(char (*) [2])local_3c,in_R9);
      std::runtime_error::runtime_error(this_00,(string *)&local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void StatsPublisher::publish(const std::string& str) {
  if (!hasSubscribers()) {
    return;
  }

  auto rv = nn_send(fd_, str.data(), str.size(), 0);
  if (rv < 0) {
    fprintf(stderr, "nn_send: %s\n", nn_strerror(nn_errno()));
    ASSERT(false);
  }
}